

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString * __thiscall SimpleString::operator+=(SimpleString *this,char *rhs)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t n;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t n_1;
  long lVar7;
  
  lVar4 = -1;
  pcVar3 = this->buffer_;
  lVar6 = 0;
  do {
    lVar5 = lVar6;
    lVar4 = lVar4 + 1;
    lVar6 = lVar5 + 1;
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
  } while (cVar1 != '\0');
  lVar7 = -1;
  do {
    lVar2 = lVar7 + 1;
    lVar7 = lVar7 + 1;
  } while (rhs[lVar2] != '\0');
  pcVar3 = copyToNewBuffer(this->buffer_,lVar7 + lVar6);
  if ((lVar7 != -1 && pcVar3 != (char *)0x0) && (pcVar3[lVar4] = *rhs, lVar7 != 0)) {
    lVar4 = 0;
    do {
      if (pcVar3[lVar4 + lVar5] == '\0') break;
      pcVar3[lVar4 + lVar6] = rhs[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (lVar7 != lVar4);
  }
  deallocateInternalBuffer(this);
  this->bufferSize_ = lVar7 + lVar6;
  this->buffer_ = pcVar3;
  return this;
}

Assistant:

SimpleString& SimpleString::operator+=(const char* rhs)
{
    size_t originalSize = this->size();
    size_t additionalStringSize = StrLen(rhs) + 1;
    size_t sizeOfNewString = originalSize + additionalStringSize;
    char* tbuffer = copyToNewBuffer(this->getBuffer(), sizeOfNewString);
    StrNCpy(tbuffer + originalSize, rhs, additionalStringSize);

    setInternalBufferTo(tbuffer, sizeOfNewString);
    return *this;
}